

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

AActor * P_SpawnMapThing(FMapThing *mthing,int position)

{
  ushort uVar1;
  short sVar2;
  DThinker *pDVar3;
  byte bVar4;
  bool bVar5;
  int j;
  uint uVar6;
  int iVar7;
  FDoomEdEntry *pFVar8;
  polyspawns_t *ppVar9;
  PClassActor *type;
  APlayerPawn *pAVar10;
  sector_t *psVar11;
  AActor *actor;
  uint uVar12;
  int iVar13;
  short *psVar14;
  ulong uVar15;
  player_t *this;
  BYTE *pBVar16;
  int i;
  long lVar17;
  double dVar18;
  FPlayerStart local_58;
  ulong local_38;
  
  if (mthing->EdNum == 0) {
    return (AActor *)0x0;
  }
  if (mthing->EdNum == -1) {
    return (AActor *)0x0;
  }
  pFVar8 = mthing->info;
  if (pFVar8 == (FDoomEdEntry *)0x0) {
    Printf("Unknown type %i at (%.1f, %.1f)\n",SUB84((mthing->pos).X,0),(mthing->pos).Y);
    pFVar8 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                       (&DoomEdMap,0);
    if (pFVar8 == (FDoomEdEntry *)0x0) {
      return (AActor *)0x0;
    }
  }
  uVar15 = 0xffffffffffffffff;
  if (pFVar8->Type == (PClassActor *)0x0) {
    if (pFVar8->Special < 1) {
      return (AActor *)0x0;
    }
    bVar4 = pFVar8->ArgsDefined;
    if ('\0' < (char)bVar4) goto LAB_004c1903;
LAB_004c1922:
    uVar1 = pFVar8->Special;
    uVar12 = uVar1 - 1;
    if (uVar12 < 8) {
      if ((level.flags._3_1_ & 2) == 0) goto LAB_004c1aee;
      bVar5 = false;
      uVar15 = (ulong)uVar12;
    }
    else {
      if (uVar1 - 0xb < 4) {
        ppVar9 = (polyspawns_t *)operator_new(0x20);
        ppVar9->next = polyspawns;
        dVar18 = (mthing->pos).Y;
        (ppVar9->pos).X = (mthing->pos).X;
        (ppVar9->pos).Y = dVar18;
        ppVar9->angle = mthing->angle;
        sVar2 = pFVar8->Special;
        ppVar9->type = sVar2;
        if (sVar2 == 0xb) {
          polyspawns = ppVar9;
          return (AActor *)0x0;
        }
        po_NumPolyobjs = po_NumPolyobjs + 1;
        polyspawns = ppVar9;
        return (AActor *)0x0;
      }
      bVar5 = true;
      if (uVar1 == 9) {
        local_58.pos.X = (mthing->pos).X;
        local_58.pos.Y = (mthing->pos).Y;
        local_58.pos.Z = (mthing->pos).Z;
        local_58.type = 0;
        local_58.angle = mthing->angle;
        TArray<FPlayerStart,_FPlayerStart>::Push(&deathmatchstarts,&local_58);
        return (AActor *)0x0;
      }
    }
  }
  else {
    bVar4 = pFVar8->ArgsDefined;
    if ((char)bVar4 < '\x01') {
      bVar5 = true;
    }
    else {
      mthing->special = (int)pFVar8->Special;
LAB_004c1903:
      memcpy(mthing->args,pFVar8->Args,(ulong)bVar4 << 2);
      bVar5 = true;
      if (pFVar8->Type == (PClassActor *)0x0) goto LAB_004c1922;
    }
  }
  uVar12 = 0x400;
  if (deathmatch.Value == 0) {
    uVar12 = (multiplayer & 1) * 0x100 + 0x100;
  }
  if ((mthing->flags & uVar12) == 0) {
    return (AActor *)0x0;
  }
  uVar12 = G_SkillProperty(SKILLP_SpawnFilter);
  if ((uVar12 & mthing->SkillFilter) == 0) {
    return (AActor *)0x0;
  }
  if (multiplayer == false) {
    uVar12 = player_t::GetSpawnClass((player_t *)(&players + (long)consoleplayer * 0x54));
    if (uVar12 != 0) {
      uVar12 = uVar12 & mthing->ClassFilter;
joined_r0x004c1a7a:
      if (uVar12 == 0) {
        return (AActor *)0x0;
      }
    }
  }
  else if (deathmatch.Value == 0) {
    this = (player_t *)&players;
    uVar12 = 0;
    local_38 = uVar15;
    for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
      if (playeringame[lVar17] == true) {
        uVar6 = player_t::GetSpawnClass(this);
        uVar12 = uVar12 | uVar6 | -(uint)(uVar6 == 0);
      }
      this = this + 1;
    }
    uVar15 = local_38;
    if (uVar12 != 0xffffffff) {
      uVar12 = uVar12 & mthing->ClassFilter;
      goto joined_r0x004c1a7a;
    }
  }
  uVar12 = (uint)uVar15;
  if (bVar5) {
    if ((pFVar8->Type == (PClassActor *)0x0) && (pFVar8->Special == 10)) {
      uVar12 = 0xffffffff;
      if (mthing->args[0] != 0xff) {
        uVar12 = mthing->args[0];
      }
      if ((int)uVar12 < 0x40) {
        local_58.pos.X = (mthing->pos).X;
        local_58.pos.Y = (mthing->pos).Y;
        psVar11 = P_PointInSector((DVector2 *)&local_58);
        psVar11->seqType = (short)uVar12;
        return (AActor *)0x0;
      }
      Printf("Sound sequence %d out of range\n",(ulong)uVar12);
      return (AActor *)0x0;
    }
    type = PClassActor::GetReplacement(pFVar8->Type,true);
    pBVar16 = (type->super_PClass).Defaults;
    if ((*(long *)(pBVar16 + 0x408) == 0) ||
       (sprites.Array[*(ushort *)(*(long *)(pBVar16 + 0x408) + 0x10)].numframes == '\0')) {
      if (((byte)gameinfo.flags & 2) != 0) {
        return (AActor *)0x0;
      }
      Printf("%s at (%.1f, %.1f) has no frames\n",SUB84((mthing->pos).X,0),(mthing->pos).Y,
             FName::NameData.NameArray
             [(type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      type = PClass::FindActor("Unknown");
      bVar5 = DObject::IsKindOf((DObject *)type,PClassActor::RegistrationInfo.MyClass);
      if (!bVar5) {
        __assert_fail("i->IsKindOf(RUNTIME_CLASS(PClassActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_mobj.cpp"
                      ,0x136c,"AActor *P_SpawnMapThing(FMapThing *, int)");
      }
      pBVar16 = (type->super_PClass).Defaults;
    }
    if (deathmatch.Value == 0) {
      if ((((multiplayer == true) && ((dmflags.Value & 0x200000U) != 0)) &&
          ((pBVar16[0x1a4] & 0x10) != 0)) && ((mthing->flags & 0x500) == 0x400)) {
        return (AActor *)0x0;
      }
    }
    else if ((pBVar16[399] & 2) != 0) {
      return (AActor *)0x0;
    }
    if ((((level.flags2 & 0x8000) != 0) || ((dmflags.Value & 0x1000U) != 0)) &&
       ((pBVar16[0x195] & 0x20) != 0)) {
      return (AActor *)0x0;
    }
    if ((deathmatch.Value != 0) || (alwaysapplydmflags.Value == true)) {
      if ((dmflags.Value & 1U) != 0) {
        bVar5 = PClass::IsAncestorOf(AHealth::RegistrationInfo.MyClass,&type->super_PClass);
        if (bVar5) {
          return (AActor *)0x0;
        }
        iVar7 = (type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
        if (iVar7 == 0x4b) {
          return (AActor *)0x0;
        }
        if (iVar7 == 0x4d) {
          return (AActor *)0x0;
        }
      }
      if (((uint)dmflags.Value >> 9 & 1) != 0) {
        bVar5 = PClass::IsAncestorOf(AArmor::RegistrationInfo.MyClass,&type->super_PClass);
        if (bVar5) {
          return (AActor *)0x0;
        }
        if ((type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index == 0x4d) {
          return (AActor *)0x0;
        }
      }
    }
    if ((pBVar16[0x18d] & 1) == 0) {
      if ((pBVar16[400] & 0x40) == 0) {
        dVar18 = -2147483648.0;
      }
      else {
        dVar18 = 2147483646.0;
      }
    }
    else {
      dVar18 = 2147483647.0;
    }
    local_58.pos.X = (mthing->pos).X;
    local_58.pos.Y = (mthing->pos).Y;
    local_58.pos.Z = dVar18;
    actor = AActor::StaticSpawn(type,&local_58.pos,NO_REPLACE,true);
    if ((dVar18 != -2147483648.0) || (NAN(dVar18))) {
      if ((dVar18 == 2147483647.0) && (!NAN(dVar18))) {
        *(double *)&((DThinker *)&(actor->__Pos).Z)->super_DObject =
             *(double *)&((DThinker *)&(actor->__Pos).Z)->super_DObject - (mthing->pos).Z;
      }
    }
    else {
      dVar18 = (mthing->pos).Z;
      *(double *)&((DThinker *)&(actor->__Pos).Z)->super_DObject =
           *(double *)&((DThinker *)&(actor->__Pos).Z)->super_DObject + dVar18;
      if (((*(byte *)&((DThinker *)((long)&(actor->flags2).Value + 2))->super_DObject & 8) != 0) &&
         ((ib_compatflags & 0x100U) != 0)) {
        *(double *)&((DThinker *)&actor->specialf1)->super_DObject = dVar18;
      }
    }
    *(double *)&((DThinker *)&(actor->SpawnPoint).Z)->super_DObject = (mthing->pos).Z;
    dVar18 = (mthing->pos).Y;
    *(double *)&((DThinker *)&actor->SpawnPoint)->super_DObject = (mthing->pos).X;
    *(double *)&((DThinker *)&(actor->SpawnPoint).Y)->super_DObject = dVar18;
    *(short *)&((DThinker *)&actor->SpawnAngle)->super_DObject = mthing->angle;
    *(DWORD *)&((DThinker *)&actor->SpawnFlags)->super_DObject = mthing->flags;
    if ((uint)mthing->FloatbobPhase < 0x40) {
      *(BYTE *)&((DThinker *)&actor->FloatBobPhase)->super_DObject = (BYTE)mthing->FloatbobPhase;
    }
    dVar18 = mthing->Gravity;
    if (0.0 <= dVar18) {
      if (dVar18 <= 0.0) {
        pDVar3 = (DThinker *)((long)&(actor->flags).Value + 1);
        *(byte *)&pDVar3->super_DObject = *(byte *)&pDVar3->super_DObject & 0xfd;
      }
      else {
        *(double *)&((DThinker *)&actor->Gravity)->super_DObject =
             dVar18 * *(double *)&((DThinker *)&actor->Gravity)->super_DObject;
      }
    }
    else {
      *(double *)&((DThinker *)&actor->Gravity)->super_DObject = -dVar18;
    }
    dVar18 = *(double *)&((DThinker *)&actor->specialf1)->super_DObject;
    if ((((dVar18 == 0.0) && (!NAN(dVar18))) ||
        (uVar12 = *(uint *)&((DThinker *)&actor->flags2)->super_DObject, (uVar12 >> 0x13 & 1) == 0))
       || ((ib_compatflags & 0x100U) == 0)) {
      P_FindFloorCeiling(actor,0xe);
      uVar12 = *(uint *)&((DThinker *)&actor->flags2)->super_DObject;
    }
    if ((uVar12 >> 0x1d & 1) == 0) {
      *(int *)&((DThinker *)&actor->special)->super_DObject = mthing->special;
      for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
        actor->args[lVar17] = mthing->args[lVar17];
      }
    }
    *(int *)&((DThinker *)&actor->tid)->super_DObject = mthing->thingid;
    AActor::AddToHash(actor);
    sVar2 = mthing->angle;
    *(double *)&((DThinker *)&(actor->Angles).Yaw)->super_DObject = (double)(int)sVar2;
    *(double *)&((DThinker *)&(actor->PrevAngles).Yaw)->super_DObject = (double)(int)sVar2;
    if ((0 < mthing->Conversation) && (iVar7 = GetConversation(mthing->Conversation), iVar7 != -1))
    {
      *(int *)&((DThinker *)&actor->ConversationRoot)->super_DObject = iVar7;
      *(FStrifeDialogueNode **)&((DThinker *)&actor->Conversation)->super_DObject =
           StrifeDialogues.Array[iVar7];
    }
    if (0.0 <= mthing->Alpha) {
      *(double *)&((DThinker *)&actor->Alpha)->super_DObject = mthing->Alpha;
    }
    uVar12 = mthing->RenderStyle;
    if (uVar12 != 0xe) {
      uVar15 = 0;
      if (uVar12 < 0xe) {
        uVar15 = (ulong)uVar12;
      }
      *(FRenderStyle *)&((DThinker *)&actor->RenderStyle)->super_DObject =
           LegacyRenderStyles[uVar15];
    }
    dVar18 = (mthing->Scale).X;
    if ((dVar18 != 0.0) || (NAN(dVar18))) {
      *(double *)&((DThinker *)&actor->Scale)->super_DObject =
           dVar18 * *(double *)&((DThinker *)&actor->Scale)->super_DObject;
    }
    dVar18 = (mthing->Scale).Y;
    if ((dVar18 != 0.0) || (NAN(dVar18))) {
      *(double *)&((DThinker *)&(actor->Scale).Y)->super_DObject =
           dVar18 * *(double *)&((DThinker *)&(actor->Scale).Y)->super_DObject;
    }
    if (mthing->pitch != 0) {
      *(double *)&((DThinker *)&actor->Angles)->super_DObject = (double)(int)mthing->pitch;
    }
    if (mthing->roll != 0) {
      *(double *)&((DThinker *)&(actor->Angles).Roll)->super_DObject = (double)(int)mthing->roll;
    }
    if (mthing->score != 0) {
      *(int *)&((DThinker *)&actor->Score)->super_DObject = mthing->score;
    }
    if (mthing->fillcolor != 0) {
      *(DWORD *)&((DThinker *)&actor->fillcolor)->super_DObject = mthing->fillcolor;
    }
    (*(actor->super_DThinker).super_DObject._vptr_DObject[9])(actor);
    if (((ulong)*(_func_int ***)&(actor->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      (*(actor->super_DThinker).super_DObject._vptr_DObject[10])(actor);
    }
    iVar7 = mthing->health;
    if (iVar7 < 1) {
      iVar13 = -iVar7;
    }
    else {
      iVar13 = *(int *)&((DThinker *)&actor->health)->super_DObject * iVar7;
    }
    *(int *)&((DThinker *)&actor->health)->super_DObject = iVar13;
    if (iVar7 != 1) {
      if (iVar7 != 0) {
        *(int *)&((DThinker *)&actor->StartHealth)->super_DObject = iVar13;
        return actor;
      }
      (*(actor->super_DThinker).super_DObject._vptr_DObject[0xf])(actor,0,0,0);
      return actor;
    }
    return actor;
  }
LAB_004c1aee:
  if (mthing->args[0] == position) {
    local_58.pos.X = (mthing->pos).X;
    local_58.pos.Y = (mthing->pos).Y;
    local_58.pos.Z = (mthing->pos).Z;
    local_58.angle = mthing->angle;
    local_58.type = (short)(uVar12 + 1);
    playerstarts[(int)uVar12].pos.Z = local_58.pos.Z;
    playerstarts[(int)uVar12].pos.X = local_58.pos.X;
    playerstarts[(int)uVar12].pos.Y = local_58.pos.Y;
    playerstarts[(int)uVar12].angle = local_58.angle;
    playerstarts[(int)uVar12].type = local_58.type;
    if ((level.flags2 & 1) == 0) {
      psVar14 = &(AllPlayerStarts.Array)->type;
      for (uVar15 = 0; AllPlayerStarts.Count != uVar15; uVar15 = uVar15 + 1) {
        if (uVar12 + 1 == (int)*psVar14) {
          *(double *)(psVar14 + -5) = local_58.pos.Z;
          (((FPlayerStart *)(psVar14 + -0xd))->pos).X = local_58.pos.X;
          *(double *)(psVar14 + -9) = local_58.pos.Y;
          *(undefined4 *)(psVar14 + -1) = local_58._24_4_;
          if (AllPlayerStarts.Count != (uint)uVar15) goto LAB_004c1cbe;
          break;
        }
        psVar14 = psVar14 + 0x10;
      }
    }
    TArray<FPlayerStart,_FPlayerStart>::Push(&AllPlayerStarts,&local_58);
LAB_004c1cbe:
    if ((deathmatch.Value == 0) && ((level.flags2 & 1) == 0)) {
      pAVar10 = P_SpawnPlayer(&local_58,uVar12,level.flags2 >> 6 & 2);
      return &pAVar10->super_AActor;
    }
  }
  return (AActor *)0x0;
}

Assistant:

AActor *P_SpawnMapThing (FMapThing *mthing, int position)
{
	PClassActor *i;
	int mask;
	AActor *mobj;

	if (mthing->EdNum == 0 || mthing->EdNum == -1)
		return NULL;

	// find which type to spawn
	FDoomEdEntry *mentry = mthing->info;

	if (mentry == NULL)
	{
		// [RH] Don't die if the map tries to spawn an unknown thing
		Printf("Unknown type %i at (%.1f, %.1f)\n",
			mthing->EdNum, mthing->pos.X, mthing->pos.Y);
		mentry = DoomEdMap.CheckKey(0);
		if (mentry == NULL)	// we need a valid entry for the rest of this function so if we can't find a default, let's exit right away.
		{
		return NULL;
	}
	}
	if (mentry->Type == NULL && mentry->Special <= 0)
	{
		// has been explicitly set to not spawning anything.
		return NULL;
	}

	// copy args to mapthing so that we have them in one place for the rest of this function	
	if (mentry->ArgsDefined > 0)
	{
		if (mentry->Type!= NULL) mthing->special = mentry->Special;
		memcpy(mthing->args, mentry->Args, sizeof(mthing->args[0]) * mentry->ArgsDefined);
	}

	int pnum = -1;
	if (mentry->Type == NULL)
	{

		switch (mentry->Special)
		{
		case SMT_DeathmatchStart:
		{
			// count deathmatch start positions
			FPlayerStart start(mthing, 0);
			deathmatchstarts.Push(start);
			return NULL;
		}

		case SMT_PolyAnchor:
		case SMT_PolySpawn:
		case SMT_PolySpawnCrush:
		case SMT_PolySpawnHurt:
	{
		polyspawns_t *polyspawn = new polyspawns_t;
		polyspawn->next = polyspawns;
		polyspawn->pos = mthing->pos;
		polyspawn->angle = mthing->angle;
		polyspawn->type = mentry->Special;
		polyspawns = polyspawn;
			if (mentry->Special != SMT_PolyAnchor)
			po_NumPolyobjs++;
		return NULL;
	}

		case SMT_Player1Start:
		case SMT_Player2Start:
		case SMT_Player3Start:
		case SMT_Player4Start:
		case SMT_Player5Start:
		case SMT_Player6Start:
		case SMT_Player7Start:
		case SMT_Player8Start:
			pnum = mentry->Special - SMT_Player1Start;
			break;

		// Sound sequence override will be handled later
		default:
			break;

	}
		}

	if (pnum == -1 || (level.flags & LEVEL_FILTERSTARTS))
	{
		// check for appropriate game type
		if (deathmatch) 
		{
			mask = MTF_DEATHMATCH;
		}
		else if (multiplayer)
		{
			mask = MTF_COOPERATIVE;
		}
		else
		{
			mask = MTF_SINGLE;
		}
		if (!(mthing->flags & mask))
		{
			return NULL;
		}

		mask = G_SkillProperty(SKILLP_SpawnFilter);
		if (!(mthing->SkillFilter & mask))
		{
			return NULL;
		}

		// Check class spawn masks. Now with player classes available
		// this is enabled for all games.
		if (!multiplayer)
		{ // Single player
			int spawnmask = players[consoleplayer].GetSpawnClass();
			if (spawnmask != 0 && (mthing->ClassFilter & spawnmask) == 0)
			{ // Not for current class
				return NULL;
			}
		}
		else if (!deathmatch)
		{ // Cooperative
			mask = 0;
			for (int i = 0; i < MAXPLAYERS; i++)
			{
				if (playeringame[i])
				{
					int spawnmask = players[i].GetSpawnClass();
					if (spawnmask != 0)
						mask |= spawnmask;
					else 
						mask = -1;
				}
			}
			if (mask != -1 && (mthing->ClassFilter & mask) == 0)
			{
				return NULL;
			}
		}
	}

	if (pnum != -1)
	{
		// [RH] Only spawn spots that match position.
		if (mthing->args[0] != position)
			return NULL;

		// save spots for respawning in network games
		FPlayerStart start(mthing, pnum+1);
		playerstarts[pnum] = start;
		if (level.flags2 & LEVEL2_RANDOMPLAYERSTARTS)
		{ // When using random player starts, all starts count
			AllPlayerStarts.Push(start);
		}
		else
		{ // When not using random player starts, later single player
		  // starts should override earlier ones, since the earlier
		  // ones are for voodoo dolls and not likely to be ideal for
		  // spawning regular players.
			unsigned i;
			for (i = 0; i < AllPlayerStarts.Size(); ++i)
			{
				if (AllPlayerStarts[i].type == pnum+1)
				{
					AllPlayerStarts[i] = start;
					break;
				}
			}
			if (i == AllPlayerStarts.Size())
			{
				AllPlayerStarts.Push(start);
			}
		}
		if (!deathmatch && !(level.flags2 & LEVEL2_RANDOMPLAYERSTARTS))
		{
			return P_SpawnPlayer(&start, pnum, (level.flags2 & LEVEL2_PRERAISEWEAPON) ? SPF_WEAPONFULLYUP : 0);
		}
		return NULL;
	}

	// [RH] sound sequence overriders
	if (mentry->Type == NULL && mentry->Special == SMT_SSeqOverride)
	{
		int type = mthing->args[0];
		if (type == 255) type = -1;
		if (type > 63)
		{
			Printf ("Sound sequence %d out of range\n", type);
		}
		else
		{
			P_PointInSector (mthing->pos)->seqType = type;
		}
		return NULL;
	}

	// [RH] If the thing's corresponding sprite has no frames, also map
	//		it to the unknown thing.
		// Handle decorate replacements explicitly here
		// to check for missing frames in the replacement object.
	i = mentry->Type->GetReplacement();

		const AActor *defaults = GetDefaultByType (i);
		if (defaults->SpawnState == NULL ||
			sprites[defaults->SpawnState->sprite].numframes == 0)
		{
			// We don't load mods for shareware games so we'll just ignore
			// missing actors. Heretic needs this since the shareware includes
			// the retail weapons in Deathmatch.
			if (gameinfo.flags & GI_SHAREWARE)
				return NULL;

			Printf ("%s at (%.1f, %.1f) has no frames\n",
					i->TypeName.GetChars(), mthing->pos.X, mthing->pos.Y);
			i = PClass::FindActor("Unknown");
			assert(i->IsKindOf(RUNTIME_CLASS(PClassActor)));
		}

	const AActor *info = GetDefaultByType (i);

	// don't spawn keycards and players in deathmatch
	if (deathmatch && info->flags & MF_NOTDMATCH)
		return NULL;

	// [RH] don't spawn extra weapons in coop if so desired
	if (multiplayer && !deathmatch && (dmflags & DF_NO_COOP_WEAPON_SPAWN))
	{
		if (GetDefaultByType(i)->flags7 & MF7_WEAPONSPAWN)
		{
			if ((mthing->flags & (MTF_DEATHMATCH|MTF_SINGLE)) == MTF_DEATHMATCH)
				return NULL;
		}
	}

	// don't spawn any monsters if -nomonsters
	if (((level.flags2 & LEVEL2_NOMONSTERS) || (dmflags & DF_NO_MONSTERS)) && info->flags3 & MF3_ISMONSTER )
	{
		return NULL;
	}
	
	// [RH] Other things that shouldn't be spawned depending on dmflags
	if (deathmatch || alwaysapplydmflags)
	{
		if (dmflags & DF_NO_HEALTH)
		{
			if (i->IsDescendantOf (RUNTIME_CLASS(AHealth)))
				return NULL;
			if (i->TypeName == NAME_Berserk)
				return NULL;
			if (i->TypeName == NAME_Megasphere)
				return NULL;
		}
		if (dmflags & DF_NO_ITEMS)
		{
//			if (i->IsDescendantOf (RUNTIME_CLASS(AArtifact)))
//				return;
		}
		if (dmflags & DF_NO_ARMOR)
		{
			if (i->IsDescendantOf (RUNTIME_CLASS(AArmor)))
				return NULL;
			if (i->TypeName == NAME_Megasphere)
				return NULL;
		}
	}

	// spawn it
	double sz;

	if (info->flags & MF_SPAWNCEILING)
		sz = ONCEILINGZ;
	else if (info->flags2 & MF2_SPAWNFLOAT)
		sz = FLOATRANDZ;
	else
		sz = ONFLOORZ;

	mobj = AActor::StaticSpawn (i, DVector3(mthing->pos, sz), NO_REPLACE, true);

	if (sz == ONFLOORZ)
	{
		mobj->AddZ(mthing->pos.Z);
		if ((mobj->flags2 & MF2_FLOATBOB) && (ib_compatflags & BCOMPATF_FLOATBOB))
		{
			mobj->specialf1 = mthing->pos.Z;
		}
	}
	else if (sz == ONCEILINGZ)
		mobj->AddZ(-mthing->pos.Z);

	mobj->SpawnPoint = mthing->pos;
	mobj->SpawnAngle = mthing->angle;
	mobj->SpawnFlags = mthing->flags;
	if (mthing->FloatbobPhase >= 0 && mthing->FloatbobPhase < 64) mobj->FloatBobPhase = mthing->FloatbobPhase;
	if (mthing->Gravity < 0) mobj->Gravity = -mthing->Gravity;
	else if (mthing->Gravity > 0) mobj->Gravity *= mthing->Gravity;
	else mobj->flags &= ~MF_NOGRAVITY;

	// For Hexen floatbob 'compatibility' we do not really want to alter the floorz.
	if (mobj->specialf1 == 0 || !(mobj->flags2 & MF2_FLOATBOB) || !(ib_compatflags & BCOMPATF_FLOATBOB))
	{
		P_FindFloorCeiling(mobj, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	}

	// if the actor got args defined either in DECORATE or MAPINFO we must ignore the map's properties.
	if (!(mobj->flags2 & MF2_ARGSDEFINED))
	{
		// [RH] Set the thing's special
		mobj->special = mthing->special;
		for(int j=0;j<5;j++) mobj->args[j]=mthing->args[j];
	}

	// [RH] Add ThingID to mobj and link it in with the others
	mobj->tid = mthing->thingid;
	mobj->AddToHash ();

	mobj->PrevAngles.Yaw = mobj->Angles.Yaw = (double)mthing->angle;

	// Check if this actor's mapthing has a conversation defined
	if (mthing->Conversation > 0)
	{
		// Make sure that this does not partially overwrite the default dialogue settings.
		int root = GetConversation(mthing->Conversation);
		if (root != -1)
		{
			mobj->ConversationRoot = root;
			mobj->Conversation = StrifeDialogues[mobj->ConversationRoot];
		}
	}

	// Set various UDMF options
	if (mthing->Alpha >= 0)
		mobj->Alpha = mthing->Alpha;
	if (mthing->RenderStyle != STYLE_Count)
		mobj->RenderStyle = (ERenderStyle)mthing->RenderStyle;
	if (mthing->Scale.X != 0)
		mobj->Scale.X = mthing->Scale.X * mobj->Scale.X;
	if (mthing->Scale.Y != 0)
		mobj->Scale.Y = mthing->Scale.Y * mobj->Scale.Y;
	if (mthing->pitch)
		mobj->Angles.Pitch = (double)mthing->pitch;
	if (mthing->roll)
		mobj->Angles.Roll = (double)mthing->roll;
	if (mthing->score)
		mobj->Score = mthing->score;
	if (mthing->fillcolor)
		mobj->fillcolor = mthing->fillcolor;

	mobj->BeginPlay ();
	if (!(mobj->ObjectFlags & OF_EuthanizeMe))
	{
		mobj->LevelSpawned ();
	}

	if (mthing->health > 0)
		mobj->health *= mthing->health;
	else
		mobj->health = -mthing->health;
	if (mthing->health == 0)
		mobj->Die(NULL, NULL);
	else if (mthing->health != 1)
		mobj->StartHealth = mobj->health;

	return mobj;
}